

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_transform_t *
golf_entity_get_world_transform
          (golf_transform_t *__return_storage_ptr__,golf_level_t *level,golf_entity_t *entity)

{
  mat4 m;
  vec3 v1;
  golf_transform_t *pgVar1;
  float fVar2;
  vec3 vVar3;
  vec3 vVar4;
  quat qVar5;
  undefined8 local_198;
  float local_190;
  float local_150;
  mat4 local_138;
  undefined8 local_f8;
  vec3 position;
  float fStack_e4;
  vec3 scale;
  quat rotation;
  golf_transform_t *transform;
  golf_transform_t *transform_1;
  golf_entity_t *parent_entity;
  undefined1 local_40 [8];
  golf_transform_t parent_transform;
  golf_entity_t *entity_local;
  golf_level_t *level_local;
  
  parent_transform.scale._4_8_ = entity;
  vVar3 = vec3_create(0.0,0.0,0.0);
  vVar4 = vec3_create(1.0,1.0,1.0);
  qVar5 = quat_create(0.0,0.0,0.0,1.0);
  golf_transform((golf_transform_t *)local_40,vVar3,vVar4,qVar5);
  if ((-1 < *(int *)(parent_transform.scale._4_8_ + 4)) &&
     (pgVar1 = golf_entity_get_transform
                         ((level->entities).data + *(int *)(parent_transform.scale._4_8_ + 4)),
     pgVar1 != (golf_transform_t *)0x0)) {
    memcpy(local_40,pgVar1,0x28);
  }
  pgVar1 = golf_entity_get_transform((golf_entity_t *)parent_transform.scale._4_8_);
  if (pgVar1 == (golf_transform_t *)0x0) {
    golf_log_warning("Attempting to get world transform on entity with no transform");
    memcpy(__return_storage_ptr__,local_40,0x28);
  }
  else {
    qVar5 = quat_multiply((quat)parent_transform._4_16_,pgVar1->rotation);
    stack0xffffffffffffff18 =
         CONCAT44(parent_transform.rotation.w * (pgVar1->scale).y,
                  parent_transform.rotation.z * (pgVar1->scale).x);
    fVar2 = parent_transform.scale.x * (pgVar1->scale).z;
    mat4_from_quat(&local_138,(quat)parent_transform._4_16_);
    m.m[2] = local_138.m[2];
    m.m[3] = local_138.m[3];
    m.m[0] = local_138.m[0];
    m.m[1] = local_138.m[1];
    m.m[4] = local_138.m[4];
    m.m[5] = local_138.m[5];
    m.m[6] = local_138.m[6];
    m.m[7] = local_138.m[7];
    m.m[8] = local_138.m[8];
    m.m[9] = local_138.m[9];
    m.m[10] = local_138.m[10];
    m.m[0xb] = local_138.m[0xb];
    m.m[0xc] = local_138.m[0xc];
    m.m[0xd] = local_138.m[0xd];
    m.m[0xe] = local_138.m[0xe];
    m.m[0xf] = local_138.m[0xf];
    vVar3 = vec3_apply_mat4(pgVar1->position,1.0,m);
    local_150 = vVar3.z;
    local_f8._0_4_ = vVar3.x;
    local_f8._0_4_ = (float)local_f8 * parent_transform.rotation.z;
    local_f8._4_4_ = vVar3.y;
    local_f8._4_4_ = local_f8._4_4_ * parent_transform.rotation.w;
    position.x = local_150 * parent_transform.scale.x;
    v1.z = position.x;
    v1.x = (float)local_f8;
    v1.y = local_f8._4_4_;
    vVar4.z = parent_transform.position.x;
    vVar4.x = (float)local_40._0_4_;
    vVar4.y = (float)local_40._4_4_;
    vVar4 = vec3_add(v1,vVar4);
    local_190 = vVar4.z;
    local_198 = vVar4._0_8_;
    position.x = local_190;
    local_f8 = local_198;
    vVar3.z = fVar2;
    vVar3.x = position.z;
    vVar3.y = fStack_e4;
    golf_transform(__return_storage_ptr__,vVar4,vVar3,qVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_entity_get_world_transform(golf_level_t *level, golf_entity_t *entity) {
    golf_transform_t parent_transform = golf_transform(V3(0, 0, 0), V3(1, 1, 1), QUAT(0, 0, 0, 1));
    if (entity->parent_idx >= 0) {
        golf_entity_t *parent_entity = &level->entities.data[entity->parent_idx];
        golf_transform_t *transform = golf_entity_get_transform(parent_entity);
        if (transform) {
            parent_transform = *transform;
        }
    }

    golf_transform_t *transform = golf_entity_get_transform(entity);
    if (!transform) {
        golf_log_warning("Attempting to get world transform on entity with no transform");
        return parent_transform;
    }

    quat rotation = quat_multiply(parent_transform.rotation, transform->rotation);

    vec3 scale = parent_transform.scale;
    scale.x *= transform->scale.x;
    scale.y *= transform->scale.y;
    scale.z *= transform->scale.z;

    vec3 position = vec3_apply_mat4(transform->position, 1, mat4_from_quat(parent_transform.rotation));
    position.x *= parent_transform.scale.x;
    position.y *= parent_transform.scale.y;
    position.z *= parent_transform.scale.z;
    position = vec3_add(position, parent_transform.position);

    return golf_transform(position, scale, rotation);
}